

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stitching.cpp
# Opt level: O0

void simple_append(string *first_geo,string *second_geo,string *output_geo,string *char_len)

{
  size_t *this;
  size_t *this_00;
  size_t *this_01;
  int iVar1;
  ostream *poVar2;
  double dStack_f8;
  int status;
  double offset;
  int highest_line_ID;
  int highest_node_ID;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  b_lines_map;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> b_nodes_map;
  map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  a_lines_map;
  map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> a_nodes_map;
  string *char_len_local;
  string *output_geo_local;
  string *second_geo_local;
  string *first_geo_local;
  
  this = &a_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::map
            ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)this);
  this_00 = &b_nodes_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::map((map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
         *)this_00);
  this_01 = &b_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::map
            ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)this_01
            );
  std::map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::map((map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
         *)&highest_line_ID);
  offset._4_4_ = 0;
  offset._0_4_ = 0;
  dStack_f8 = 0.0;
  iVar1 = read_in_geofiles(first_geo,second_geo,output_geo,
                           (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                            *)this,(map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                                    *)this_00,
                           (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                            *)this_01,
                           (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                            *)&highest_line_ID);
  if (iVar1 == 0) {
    iVar1 = calculate_shifting_parameters
                      ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                        *)&a_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                        *)&b_nodes_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (int *)((long)&offset + 4),(int *)&offset,&stack0xffffffffffffff08);
    if (iVar1 == 0) {
      iVar1 = shift_file_b((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                            *)&b_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                            *)&highest_line_ID,(int *)((long)&offset + 4),(int *)&offset,
                           &stack0xffffffffffffff08);
      if (iVar1 == 0) {
        print_stitched_file((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                             *)&a_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                             *)&b_nodes_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>
                             *)&b_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
                             *)&highest_line_ID,output_geo,char_len);
        poVar2 = std::operator<<((ostream *)&std::cout,"Program finished execution.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Shifting of nodes failed.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "Error: Failed to calculate shifting parameters.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: unable to read in geofiles.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::~map((map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
          *)&highest_line_ID);
  std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::~map
            ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)
             &b_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
  ::~map((map<int,_stitch::line,_std::less<int>,_std::allocator<std::pair<const_int,_stitch::line>_>_>
          *)&b_nodes_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_>::~map
            ((map<int,_node,_std::less<int>,_std::allocator<std::pair<const_int,_node>_>_> *)
             &a_lines_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void simple_append(     std::string first_geo,
                        std::string second_geo,
                        std::string output_geo,
                        std::string char_len)
{
    std::map<int, node> a_nodes_map;
    std::map<int, stitch::line> a_lines_map;
    std::map<int, node> b_nodes_map;
    std::map<int, stitch::line> b_lines_map;
    int highest_node_ID = 0;
    int highest_line_ID = 0;
    double offset = 0;
    int status = read_in_geofiles(  first_geo, second_geo, output_geo,
                                    a_nodes_map, a_lines_map,
                                    b_nodes_map, b_lines_map);
    if (status==0)
    {
        status = calculate_shifting_parameters( a_nodes_map, a_lines_map, highest_node_ID,
                                                highest_line_ID, offset );
        if (status==0)
        {
            status = shift_file_b(b_nodes_map, b_lines_map, highest_node_ID, highest_line_ID, offset);
            if (status==0)
            {
                print_stitched_file(a_nodes_map, a_lines_map, b_nodes_map, b_lines_map, output_geo, char_len);
                std::cout << "Program finished execution." << endl;
            }
            else
            {
                std::cout << "Shifting of nodes failed."<< endl;
            }
        }
        else
        {
            std::cout << "Error: Failed to calculate shifting parameters." << endl;
        }
    }
    else
    {
        std::cout << "Error: unable to read in geofiles." << endl;
    }
}